

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_lyb.c
# Opt level: O0

int lyb_print_data(lyout *out,lyd_node *root,int options)

{
  lys_module *plVar1;
  bool bVar2;
  undefined1 local_98 [8];
  lyb_state lybs;
  lys_node *parent;
  lys_module *prev_mod;
  hash_table *top_sibling_ht;
  int local_30;
  int iStack_2c;
  uint8_t zero;
  int rc;
  int ret;
  int r;
  int options_local;
  lyd_node *root_local;
  lyout *out_local;
  
  iStack_2c = 0;
  local_30 = 0;
  top_sibling_ht._7_1_ = 0;
  prev_mod = (lys_module *)0x0;
  parent = (lys_node *)0x0;
  ret = options;
  _r = root;
  root_local = (lyd_node *)out;
  memset(local_98,0,0x48);
  if (_r != (lyd_node *)0x0) {
    plVar1 = lyd_node_module(_r);
    lybs._40_8_ = plVar1->ctx;
    lybs._64_8_ = lys_parent(_r->schema);
    while( true ) {
      bVar2 = false;
      if (lybs._64_8_ != 0) {
        bVar2 = *(int *)(lybs._64_8_ + 0x38) == 0x1000;
      }
      if (!bVar2) break;
      lybs._64_8_ = lys_parent((lys_node *)lybs._64_8_);
    }
    if ((lybs._64_8_ != 0) && (*(int *)(lybs._64_8_ + 0x38) != 0x10000)) {
      ly_log((ly_ctx *)lybs._40_8_,LY_LLERR,LY_EINVAL,
             "LYB printer supports only printing top-level nodes.");
      return 1;
    }
  }
  rc = lyb_print_magic_number((lyout *)root_local);
  iStack_2c = rc + iStack_2c;
  if (rc < 0) {
    local_30 = 1;
  }
  else {
    rc = lyb_print_header((lyout *)root_local);
    iStack_2c = rc + iStack_2c;
    if (rc < 0) {
      local_30 = 1;
    }
    else {
      rc = lyb_print_data_models((lyout *)root_local,_r,(lyb_state *)local_98);
      iStack_2c = rc + iStack_2c;
      if (rc < 0) {
        local_30 = 1;
      }
      else {
        for (; _r != (lyd_node *)0x0; _r = _r->next) {
          plVar1 = lyd_node_module(_r);
          if (plVar1 != (lys_module *)parent) {
            prev_mod = (lys_module *)0x0;
            parent = (lys_node *)lyd_node_module(_r);
          }
          rc = lyb_print_subtree((lyout *)root_local,_r,(hash_table **)&prev_mod,
                                 (lyb_state *)local_98,1);
          iStack_2c = rc + iStack_2c;
          if (rc < 0) {
            local_30 = 1;
            goto LAB_001e6c7f;
          }
          if ((ret & 1U) == 0) break;
        }
        rc = lyb_write((lyout *)root_local,(uint8_t *)((long)&top_sibling_ht + 7),1,
                       (lyb_state *)local_98);
        iStack_2c = rc + iStack_2c;
        if (rc < 0) {
          local_30 = 1;
        }
      }
    }
  }
LAB_001e6c7f:
  free((void *)local_98);
  free(lybs.written);
  free(lybs.position);
  for (rc = 0; rc < (int)lybs.sib_ht; rc = rc + 1) {
    lyht_free(*(hash_table **)((long)&((lybs.ctx)->dict).lock + (long)rc * 0x10));
  }
  free(lybs.ctx);
  return local_30;
}

Assistant:

int
lyb_print_data(struct lyout *out, const struct lyd_node *root, int options)
{
    int r, ret = 0, rc = EXIT_SUCCESS;
    uint8_t zero = 0;
    struct hash_table *top_sibling_ht = NULL;
    const struct lys_module *prev_mod = NULL;
    struct lys_node *parent;
    struct lyb_state lybs;

    memset(&lybs, 0, sizeof lybs);

    if (root) {
        lybs.ctx = lyd_node_module(root)->ctx;

        for (parent = lys_parent(root->schema); parent && (parent->nodetype == LYS_USES); parent = lys_parent(parent));
        if (parent && (parent->nodetype != LYS_EXT)) {
            LOGERR(lybs.ctx, LY_EINVAL, "LYB printer supports only printing top-level nodes.");
            return EXIT_FAILURE;
        }
    }

    /* LYB magic number */
    ret += (r = lyb_print_magic_number(out));
    if (r < 0) {
        rc = EXIT_FAILURE;
        goto finish;
    }

    /* LYB header */
    ret += (r = lyb_print_header(out));
    if (r < 0) {
        rc = EXIT_FAILURE;
        goto finish;
    }

    /* all used models */
    ret += (r = lyb_print_data_models(out, root, &lybs));
    if (r < 0) {
        rc = EXIT_FAILURE;
        goto finish;
    }

    LY_TREE_FOR(root, root) {
        /* do not reuse sibling hash tables from different modules */
        if (lyd_node_module(root) != prev_mod) {
            top_sibling_ht = NULL;
            prev_mod = lyd_node_module(root);
        }

        ret += (r = lyb_print_subtree(out, root, &top_sibling_ht, &lybs, 1));
        if (r < 0) {
            rc = EXIT_FAILURE;
            goto finish;
        }

        if (!(options & LYP_WITHSIBLINGS)) {
            break;
        }
    }

    /* ending zero byte */
    ret += (r = lyb_write(out, &zero, sizeof zero, &lybs));
    if (r < 0) {
        rc = EXIT_FAILURE;
    }

finish:
    free(lybs.written);
    free(lybs.position);
    free(lybs.inner_chunks);
    for (r = 0; r < lybs.sib_ht_count; ++r) {
        lyht_free(lybs.sib_ht[r].ht);
    }
    free(lybs.sib_ht);

    return rc;
}